

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::IntegralType::fromSyntax
                 (Compilation *compilation,SyntaxKind integerKind,
                 span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
                 dimensions,bool isSigned,ASTContext *context)

{
  ConstantRange CVar1;
  bool bVar2;
  iterator this;
  iterator elementType;
  reference ppVVar3;
  size_type sVar4;
  reference ppVar5;
  int in_ESI;
  byte in_R8B;
  pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*> *pair;
  size_t i;
  size_t count;
  Type *result;
  ConstantRange range;
  bitmask<slang::ast::IntegralFlags> flags;
  EvaluatedDimension dim;
  VariableDimensionSyntax *dimSyntax;
  iterator __end2;
  iterator __begin2;
  span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL> *__range2;
  SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>
  dims;
  VariableDimensionSyntax *in_stack_fffffffffffffe38;
  ASTContext *in_stack_fffffffffffffe40;
  Compilation *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  bitmask<slang::ast::IntegralFlags> flags_00;
  Compilation *in_stack_fffffffffffffe58;
  ulong local_168;
  Type *local_150;
  int local_144;
  int iStack_140;
  bitmask<slang::ast::IntegralFlags> local_13c;
  bitmask<slang::ast::IntegralFlags> local_13b;
  bitmask<slang::ast::IntegralFlags> local_13a;
  bitmask<slang::ast::IntegralFlags> local_139;
  undefined4 local_138;
  SyntaxNode *in_stack_fffffffffffffef0;
  VariableDimensionSyntax *in_stack_fffffffffffffef8;
  undefined1 *puVar6;
  bitmask<slang::ast::IntegralFlags> flags_01;
  SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
  local_e8 [3];
  byte local_25;
  int local_24;
  undefined1 local_18 [16];
  Type *local_8;
  
  local_25 = in_R8B & 1;
  local_24 = in_ESI;
  SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>::
  SmallVector((SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>
               *)0x80a617);
  puVar6 = local_18;
  this = std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>::
         begin((span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffe38);
  elementType = std::
                span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>::
                end((span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
                     *)in_stack_fffffffffffffe48);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_slang::syntax::VariableDimensionSyntax_*const_*,_std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::syntax::VariableDimensionSyntax_*const_*,_std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<const_slang::syntax::VariableDimensionSyntax_*const_*,_std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe38);
    flags_01.m_bits = (underlying_type)((ulong)puVar6 >> 0x38);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<const_slang::syntax::VariableDimensionSyntax_*const_*,_std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<const_slang::syntax::VariableDimensionSyntax_*const_*,_std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffff08);
    in_stack_fffffffffffffef8 = *ppVVar3;
    ASTContext::evalPackedDimension(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,slang::syntax::SyntaxNode_const*>>::
    emplace_back<slang::ast::EvaluatedDimension&,slang::syntax::VariableDimensionSyntax_const*&>
              ((SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
                *)in_stack_fffffffffffffe48,(EvaluatedDimension *)in_stack_fffffffffffffe40,
               (VariableDimensionSyntax **)in_stack_fffffffffffffe38);
    __gnu_cxx::
    __normal_iterator<const_slang::syntax::VariableDimensionSyntax_*const_*,_std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::syntax::VariableDimensionSyntax_*const_*,_std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffff08);
  }
  bVar2 = SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
          ::empty(local_e8);
  if (bVar2) {
    local_8 = Type::getPredefinedType
                        (in_stack_fffffffffffffe58,
                         (SyntaxKind)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffffe50 >> 0x18,0));
  }
  else {
    bitmask<slang::ast::IntegralFlags>::bitmask(&local_139);
    flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffe50 >> 0x38);
    if (local_24 == 400) {
      bitmask<slang::ast::IntegralFlags>::bitmask(&local_13a,Reg);
      bitmask<slang::ast::IntegralFlags>::operator|=(&local_139,&local_13a);
    }
    if ((local_25 & 1) != 0) {
      bitmask<slang::ast::IntegralFlags>::bitmask(&local_13b,Signed);
      bitmask<slang::ast::IntegralFlags>::operator|=(&local_139,&local_13b);
    }
    if (local_24 != 0x36) {
      bitmask<slang::ast::IntegralFlags>::bitmask(&local_13c,FourState);
      bitmask<slang::ast::IntegralFlags>::operator|=(&local_139,&local_13c);
    }
    sVar4 = SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
            ::size(local_e8);
    if (sVar4 == 1) {
      ppVar5 = SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
               ::operator[](local_e8,0);
      bVar2 = EvaluatedDimension::isRange(&ppVar5->first);
      if (bVar2) {
        ppVar5 = SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
                 ::operator[](local_e8,0);
        CVar1 = (ppVar5->first).range;
        iStack_140 = CVar1.right;
        if ((iStack_140 == 0) && (local_144 = CVar1.left, -1 < local_144)) {
          ConstantRange::width((ConstantRange *)0x80a89d);
          local_8 = Compilation::getType
                              ((Compilation *)this._M_current,
                               (bitwidth_t)((ulong)elementType._M_current >> 0x20),flags_01);
          goto LAB_0080a9d6;
        }
      }
    }
    local_150 = Compilation::getScalarType(in_stack_fffffffffffffe48,flags_00);
    sVar4 = SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
            ::size(local_e8);
    for (local_168 = 0; local_168 < sVar4; local_168 = local_168 + 1) {
      SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>_>
      ::operator[](local_e8,~local_168 + sVar4);
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x80a97d);
      local_150 = PackedArrayType::fromSyntax
                            ((Scope *)this._M_current,(Type *)elementType._M_current,
                             (EvaluatedDimension *)in_stack_fffffffffffffef8,
                             in_stack_fffffffffffffef0);
    }
    local_8 = local_150;
  }
LAB_0080a9d6:
  local_138 = 1;
  SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>::
  ~SmallVector((SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>
                *)0x80a9e3);
  return local_8;
}

Assistant:

const Type& IntegralType::fromSyntax(Compilation& compilation, SyntaxKind integerKind,
                                     std::span<const VariableDimensionSyntax* const> dimensions,
                                     bool isSigned, const ASTContext& context) {
    // This is a simple integral vector (possibly of just one element).
    SmallVector<std::pair<EvaluatedDimension, const SyntaxNode*>, 4> dims;
    for (auto dimSyntax : dimensions) {
        auto dim = context.evalPackedDimension(*dimSyntax);
        dims.emplace_back(dim, dimSyntax);
    }

    if (dims.empty())
        return getPredefinedType(compilation, integerKind, isSigned);

    bitmask<IntegralFlags> flags;
    if (integerKind == SyntaxKind::RegType)
        flags |= IntegralFlags::Reg;
    if (isSigned)
        flags |= IntegralFlags::Signed;
    if (integerKind != SyntaxKind::BitType)
        flags |= IntegralFlags::FourState;

    if (dims.size() == 1 && dims[0].first.isRange()) {
        auto range = dims[0].first.range;
        if (range.right == 0 && range.left >= 0) {
            // if we have the common case of only one dimension and lsb == 0
            // then we can use the shared representation
            return compilation.getType(range.width(), flags);
        }
    }

    const Type* result = &compilation.getScalarType(flags);
    size_t count = dims.size();
    for (size_t i = 0; i < count; i++) {
        auto& pair = dims[count - i - 1];
        result = &PackedArrayType::fromSyntax(*context.scope, *result, pair.first, *pair.second);
    }

    return *result;
}